

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::SetEscapedValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value,
          TemplateModifier *escfn)

{
  TemplateString value_00;
  uint7 uStack_7f;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  TemplateModifier::operator()(&local_50,escfn,value.ptr_,value.length_,&local_70);
  value_00.length_ = local_50._M_string_length;
  value_00.ptr_ = local_50._M_dataplus._M_p;
  value_00._16_8_ = (ulong)uStack_7f << 8;
  value_00.id_ = 0;
  SetValue(this,variable,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TemplateDictionary::SetEscapedValue(TemplateString variable,
                                         TemplateString value,
                                         const TemplateModifier& escfn) {
  SetValue(variable, string(escfn(value.data(), value.size())));
}